

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makeDebugFunctionType
          (Builder *this,Id returnType,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes)

{
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  uint typeId;
  Op OVar1;
  uint *puVar2;
  Id IVar3;
  mapped_type_conflict *pmVar4;
  Instruction *this_01;
  Id *pIVar5;
  Id IVar6;
  uint *puVar7;
  Id local_40;
  Id returnType_local;
  uint paramType;
  undefined4 uStack_34;
  
  this_00 = &this->debugId;
  returnType_local = returnType;
  pmVar4 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](this_00,&returnType_local);
  if (*pmVar4 != 0) {
    IVar6 = this->uniqueId + 1;
    this->uniqueId = IVar6;
    this_01 = (Instruction *)::operator_new(0x60);
    IVar3 = makeVoidType(this);
    this_01->_vptr_Instruction = (_func_int **)&PTR__Instruction_00a5fd48;
    this_01->resultId = IVar6;
    this_01->typeId = IVar3;
    this_01->opCode = OpExtInst;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_01->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    this_01->block = (Block *)0x0;
    Instruction::reserveOperands
              (this_01,((long)(paramTypes->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(paramTypes->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 2) + 4);
    Instruction::addIdOperand(this_01,this->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand(this_01,8);
    IVar3 = makeUintConstant(this,3,false);
    Instruction::addIdOperand(this_01,IVar3);
    pmVar4 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](this_00,&returnType_local);
    Instruction::addIdOperand(this_01,*pmVar4);
    puVar2 = (paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar7 = (paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1) {
      typeId = *puVar7;
      paramType = typeId;
      OVar1 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[typeId]->opCode;
      if ((OVar1 == OpTypePointer) || (OVar1 == OpTypeArray)) {
        local_40 = getContainedTypeId(this,typeId);
        pIVar5 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](this_00,&local_40);
      }
      else {
        pIVar5 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](this_00,&paramType);
      }
      Instruction::addIdOperand(this_01,*pIVar5);
    }
    _paramType = this_01;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&paramType);
    if (_paramType != (Instruction *)0x0) {
      (*_paramType->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this->module,this_01);
    return IVar6;
  }
  __assert_fail("debugId[returnType] != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x2a6,"Id spv::Builder::makeDebugFunctionType(Id, const std::vector<Id> &)");
}

Assistant:

Id Builder::makeDebugFunctionType(Id returnType, const std::vector<Id>& paramTypes)
{
    assert(debugId[returnType] != 0);

    Id typeId = getUniqueId();
    auto type = new Instruction(typeId, makeVoidType(), OpExtInst);
    type->reserveOperands(paramTypes.size() + 4);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeFunction);
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsPublic));
    type->addIdOperand(debugId[returnType]);
    for (auto const paramType : paramTypes) {
        if (isPointerType(paramType) || isArrayType(paramType)) {
            type->addIdOperand(debugId[getContainedTypeId(paramType)]);
        }
        else {
            type->addIdOperand(debugId[paramType]);
        }
    }
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);
    return typeId;
}